

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns::dump_block_properties
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  bool bVar1;
  ulong local_60;
  int64_t inner_val;
  int inner_type;
  int rank;
  int is_undef;
  int outer_type;
  int64_t val;
  char *p_out;
  char *pcStack_30;
  int cdns_version_local;
  char *out_max_local;
  char *out_buf_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns *this_local;
  
  rank = (int)(uint)*in >> 5;
  inner_type = 0;
  p_out._4_4_ = cdns_version;
  pcStack_30 = out_max;
  out_max_local = out_buf;
  out_buf_local = (char *)in_max;
  in_max_local = in;
  in_local = (uint8_t *)this;
  in_max_local = cbor_get_number(in,in_max,(int64_t *)&is_undef);
  if ((in_max_local == (uint8_t *)0x0) || (rank != 5)) {
    fprintf((FILE *)F_out,"   Error, cannot parse the first bytes of properties, type: %d.\n",
            (ulong)(uint)rank);
    *err = -3;
    in_max_local = (uint8_t *)0x0;
  }
  else {
    inner_val._4_4_ = 0;
    fprintf((FILE *)F_out,"        [\n");
    if (_is_undef == -1) {
      inner_type = 1;
      _is_undef = 0xffffffff;
    }
    while( true ) {
      bVar1 = false;
      if ((0 < _is_undef) && (bVar1 = false, in_max_local != (uint8_t *)0x0)) {
        bVar1 = in_max_local < out_buf_local;
      }
      if (!bVar1) goto LAB_0017b716;
      if (*in_max_local == 0xff) break;
      inner_val._0_4_ = (int)(uint)*in_max_local >> 5;
      in_max_local = cbor_get_number(in_max_local,(uint8_t *)out_buf_local,(int64_t *)&local_60);
      if ((uint)inner_val == 0) {
        if (inner_val._4_4_ != 0) {
          fprintf((FILE *)F_out,",\n");
        }
        inner_val._4_4_ = inner_val._4_4_ + 1;
        fprintf((FILE *)F_out,"            %d, ",local_60 & 0xffffffff);
        if (local_60 == 2) {
          in_max_local = dump_block_tables(this,in_max_local,(uint8_t *)out_buf_local,out_max_local,
                                           pcStack_30,p_out._4_4_,err,F_out);
        }
        else if (local_60 == 3) {
          fprintf((FILE *)F_out,"[\n");
          in_max_local = dump_queries(this,in_max_local,(uint8_t *)out_buf_local,out_max_local,
                                      pcStack_30,p_out._4_4_,err,F_out);
          fprintf((FILE *)F_out,"            ]");
        }
        else if (local_60 == 4) {
          fprintf((FILE *)F_out,"[\n");
          in_max_local = dump_list(this,in_max_local,(uint8_t *)out_buf_local,out_max_local,
                                   pcStack_30,"                ","address-event-counts",err,F_out);
          fprintf((FILE *)F_out,"            ]");
        }
        else {
          val = (int64_t)out_max_local;
          in_max_local = cbor_to_text(in_max_local,(uint8_t *)out_buf_local,(char **)&val,pcStack_30
                                      ,err);
          fwrite(out_max_local,1,val - (long)out_max_local,(FILE *)F_out);
        }
        _is_undef = _is_undef + -1;
      }
      else {
        fprintf((FILE *)F_out,"            Unexpected type: %d(%d)\n",(ulong)(uint)inner_val,
                local_60 & 0xffffffff);
        *err = -3;
        in_max_local = (uint8_t *)0x0;
      }
    }
    fprintf((FILE *)F_out,"\n            --end of array");
    if (inner_type == 0) {
      fprintf((FILE *)F_out,"            Error, end of array mark unexpected.\n");
      *err = -3;
      in_max_local = (uint8_t *)0x0;
    }
    else {
      in_max_local = in_max_local + 1;
    }
LAB_0017b716:
    if (in_max_local != (uint8_t *)0x0) {
      fprintf((FILE *)F_out,"\n        ]\n");
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns::dump_block_properties(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_MAP) {
        fprintf(F_out, "   Error, cannot parse the first bytes of properties, type: %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;
        fprintf(F_out, "        [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max ) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "            Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    fprintf(F_out, "            %d, ", (int)inner_val);
                    if (inner_val == 2) {
                        in = dump_block_tables(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                    }
                    else if (inner_val == 3) {
                        fprintf(F_out, "[\n");
                        in = dump_queries(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else if (inner_val == 4) {
                        fprintf(F_out, "[\n");
                        in = dump_list(in, in_max, out_buf, out_max, "                ", "address-event-counts", err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else {
                        p_out = out_buf;
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]\n");
        }
    }

    return in;
}